

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O1

int libssh2_channel_x11_req_ex
              (LIBSSH2_CHANNEL *channel,int single_connection,char *auth_proto,char *auth_cookie,
              int screen_number)

{
  uchar uVar1;
  LIBSSH2_SESSION *session;
  int iVar2;
  uint uVar3;
  size_t len;
  size_t __n;
  uchar *puVar4;
  char *errmsg;
  uchar **buf;
  size_t sVar5;
  long lVar6;
  bool bVar7;
  uchar *s;
  int local_90;
  uint32_t local_8c;
  uchar *local_88;
  char *local_80;
  size_t local_78;
  char *local_70;
  packet_requirev_state_t *local_68;
  time_t local_60;
  char *local_58;
  uchar *local_50;
  uchar buffer [17];
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    iVar2 = -0x27;
  }
  else {
    buf = (uchar **)(ulong)(uint)single_connection;
    local_80 = auth_cookie;
    local_60 = time((time_t *)0x0);
    local_70 = "MIT-MAGIC-COOKIE-1";
    if (auth_proto != (char *)0x0) {
      local_70 = auth_proto;
    }
    local_88 = channel->reqX11_local_channel;
    local_68 = &channel->reqX11_packet_requirev_state;
    local_58 = auth_proto;
    do {
      session = channel->session;
      if (local_58 == (char *)0x0) {
        len = 0x12;
      }
      else {
        len = strlen(local_58);
      }
      if (local_80 == (char *)0x0) {
        __n = 0x20;
      }
      else {
        __n = strlen(local_80);
      }
      if (channel->reqX11_state == libssh2_NB_state_idle) {
        sVar5 = len + __n + 0x1e;
        channel->reqX11_packet_len = sVar5;
        (channel->reqX11_packet_requirev_state).start = 0;
        puVar4 = (uchar *)(*session->alloc)(sVar5,&session->abstract);
        channel->reqX11_packet = puVar4;
        if (puVar4 == (uchar *)0x0) {
          iVar2 = -6;
          errmsg = "Unable to allocate memory for pty-request";
          s = (uchar *)0x0;
          goto LAB_0010b31b;
        }
        s = puVar4 + 1;
        *puVar4 = 'b';
        buf = &s;
        _libssh2_store_u32(buf,(channel->remote).id);
        _libssh2_store_str(buf,"x11-req",7);
        puVar4 = s + 1;
        *s = '\x01';
        s = s + 2;
        *puVar4 = single_connection != 0;
        _libssh2_store_str(buf,local_70,len);
        _libssh2_store_u32(buf,(uint32_t)__n);
        if (local_80 != (char *)0x0) {
          memcpy(s,local_80,__n);
LAB_0010b11a:
          s = s + __n;
          _libssh2_store_u32(&s,screen_number);
          channel->reqX11_state = libssh2_NB_state_created;
          goto LAB_0010b138;
        }
        local_8c = screen_number;
        local_78 = __n;
        local_90 = _libssh2_openssl_random(buffer,0x10);
        if (local_90 == 0) {
          lVar6 = 0;
          do {
            snprintf((char *)(s + lVar6),3,"%02X");
            lVar6 = lVar6 + 2;
          } while (lVar6 != 0x20);
        }
        else {
          uVar3 = _libssh2_error(session,-0x31,"Unable to get random bytes for x11-req cookie");
          buf = (uchar **)(ulong)uVar3;
        }
        __n = local_78;
        screen_number = local_8c;
        if (local_90 == 0) goto LAB_0010b11a;
      }
      else {
LAB_0010b138:
        if (channel->reqX11_state == libssh2_NB_state_created) {
          iVar2 = _libssh2_transport_send
                            (session,channel->reqX11_packet,channel->reqX11_packet_len,(uchar *)0x0,
                             0);
          if (iVar2 != 0) {
            if (iVar2 != -0x25) {
              (*session->free)(channel->reqX11_packet,&session->abstract);
              channel->reqX11_packet = (uchar *)0x0;
              channel->reqX11_state = libssh2_NB_state_idle;
              errmsg = "Unable to send x11-req packet";
              goto LAB_0010b31b;
            }
            buf = (uchar **)0xffffffdb;
            _libssh2_error(session,-0x25,"Would block sending X11-req packet");
            goto LAB_0010b322;
          }
          (*session->free)(channel->reqX11_packet,&session->abstract);
          channel->reqX11_packet = (uchar *)0x0;
          _libssh2_htonu32(local_88,(channel->local).id);
          channel->reqX11_state = libssh2_NB_state_sent;
        }
        if (channel->reqX11_state == libssh2_NB_state_sent) {
          iVar2 = _libssh2_packet_requirev
                            (session,"cd",&local_50,(size_t *)buffer,1,local_88,4,local_68);
          if (iVar2 == -0x25) {
            buf = (uchar **)0xffffffdb;
LAB_0010b306:
            bVar7 = false;
          }
          else {
            if ((iVar2 != 0) || (buffer._0_8_ == 0)) {
              channel->reqX11_state = libssh2_NB_state_idle;
              uVar3 = _libssh2_error(session,iVar2,"waiting for x11-req response packet");
              buf = (uchar **)(ulong)uVar3;
              goto LAB_0010b306;
            }
            uVar1 = *local_50;
            (*session->free)(local_50,&session->abstract);
            channel->reqX11_state = libssh2_NB_state_idle;
            bVar7 = uVar1 != 'c';
            buf = (uchar **)((ulong)buf & 0xffffffff);
            if (!bVar7) {
              buf = (uchar **)0x0;
            }
          }
          if (!bVar7) goto LAB_0010b322;
        }
        iVar2 = -0x16;
        errmsg = "Unable to complete request for channel x11-req";
LAB_0010b31b:
        uVar3 = _libssh2_error(session,iVar2,errmsg);
        buf = (uchar **)(ulong)uVar3;
      }
LAB_0010b322:
      if ((int)buf != -0x25) {
        return (int)buf;
      }
      if (channel->session->api_block_mode == 0) {
        return -0x25;
      }
      iVar2 = _libssh2_wait_socket(channel->session,local_60);
    } while (iVar2 == 0);
  }
  return iVar2;
}

Assistant:

LIBSSH2_API int
libssh2_channel_x11_req_ex(LIBSSH2_CHANNEL *channel, int single_connection,
                           const char *auth_proto, const char *auth_cookie,
                           int screen_number)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 channel_x11_req(channel, single_connection, auth_proto,
                                 auth_cookie, screen_number));
    return rc;
}